

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_ul_setup(Curl_easy *data,_Bool sizechecked)

{
  connectdata *pcVar1;
  FILEPROTO *pFVar2;
  bool bVar3;
  int iVar4;
  CURLcode CVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  byte bVar10;
  long lVar11;
  undefined7 in_register_00000031;
  long lVar12;
  
  pcVar1 = data->conn;
  bVar10 = (data->set).field_0x8e3;
  lVar11 = (data->state).resume_from;
  bVar3 = lVar11 != 0;
  if ((int)CONCAT71(in_register_00000031,sizechecked) != 0) {
    bVar3 = 0 < lVar11;
  }
  if (!bVar3) goto LAB_00132c82;
  if (lVar11 < 0) {
    bVar3 = false;
    CVar5 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"SIZE %s",(pcVar1->proto).ftpc.file);
    if (CVar5 == CURLE_OK) {
      (data->conn->proto).ftpc.state = FTP_STOR_SIZE;
      bVar3 = false;
    }
  }
  else {
    pFVar2 = (data->req).p.file;
    if (pcVar1->seek_func == (curl_seek_callback)0x0) {
      iVar4 = 0;
    }
    else {
      Curl_set_in_callback(data,true);
      iVar4 = (*pcVar1->seek_func)(pcVar1->seek_client,(data->state).resume_from,0);
      Curl_set_in_callback(data,false);
    }
    if (iVar4 != 0) {
      if (iVar4 != 2) {
        pcVar9 = "Could not seek stream";
LAB_00132c68:
        bVar3 = false;
        Curl_failf(data,pcVar9);
        CVar5 = CURLE_FTP_COULDNT_USE_REST;
        bVar10 = 1;
        goto LAB_00132c7d;
      }
      lVar11 = 0;
      do {
        lVar12 = (data->state).resume_from - lVar11;
        sVar6 = (size_t)(data->set).buffer_size;
        if (lVar12 <= (long)sVar6) {
          sVar6 = curlx_sotouz(lVar12);
        }
        sVar7 = (*(data->state).fread_func)((data->state).buffer,1,sVar6,(data->state).in);
        if (sVar6 <= sVar7 - 1) {
          pcVar9 = "Failed to read data";
          goto LAB_00132c68;
        }
        lVar11 = lVar11 + sVar7;
      } while (lVar11 < (data->state).resume_from);
    }
    lVar11 = (data->state).infilesize;
    CVar5 = CURLE_FTP_COULDNT_USE_REST;
    bVar10 = 1;
    bVar3 = true;
    if ((0 < lVar11) &&
       (lVar12 = (data->state).resume_from, lVar8 = lVar11 - lVar12,
       (data->state).infilesize = lVar8, lVar8 == 0 || lVar11 < lVar12)) {
      bVar3 = false;
      Curl_infof(data,"File already completely uploaded");
      Curl_setup_transfer(data,-1,-1,false,-1);
      pFVar2->fd = 2;
      (data->conn->proto).ftpc.state = FTP_STOP;
      bVar10 = 1;
      CVar5 = CURLE_OK;
    }
  }
LAB_00132c7d:
  if (!bVar3) {
    return CVar5;
  }
LAB_00132c82:
  pcVar9 = "STOR %s";
  if ((bVar10 & 1) != 0) {
    pcVar9 = "APPE %s";
  }
  CVar5 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,pcVar9,(pcVar1->proto).ftpc.file);
  if (CVar5 == CURLE_OK) {
    (data->conn->proto).ftpc.state = FTP_STOR;
  }
  return CVar5;
}

Assistant:

static CURLcode ftp_state_ul_setup(struct Curl_easy *data,
                                   bool sizechecked)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  bool append = data->set.remote_append;

  if((data->state.resume_from && !sizechecked) ||
     ((data->state.resume_from > 0) && sizechecked)) {
    /* we're about to continue the uploading of a file */
    /* 1. get already existing file's size. We use the SIZE command for this
       which may not exist in the server!  The SIZE command is not in
       RFC959. */

    /* 2. This used to set REST. But since we can do append, we
       don't another ftp command. We just skip the source file
       offset and then we APPEND the rest on the file instead */

    /* 3. pass file-size number of bytes in the source file */
    /* 4. lower the infilesize counter */
    /* => transfer as usual */
    int seekerr = CURL_SEEKFUNC_OK;

    if(data->state.resume_from < 0) {
      /* Got no given size to start from, figure it out */
      result = Curl_pp_sendf(data, &ftpc->pp, "SIZE %s", ftpc->file);
      if(!result)
        state(data, FTP_STOR_SIZE);
      return result;
    }

    /* enable append */
    append = TRUE;

    /* Let's read off the proper amount of bytes from the input. */
    if(conn->seek_func) {
      Curl_set_in_callback(data, true);
      seekerr = conn->seek_func(conn->seek_client, data->state.resume_from,
                                SEEK_SET);
      Curl_set_in_callback(data, false);
    }

    if(seekerr != CURL_SEEKFUNC_OK) {
      curl_off_t passed = 0;
      if(seekerr != CURL_SEEKFUNC_CANTSEEK) {
        failf(data, "Could not seek stream");
        return CURLE_FTP_COULDNT_USE_REST;
      }
      /* seekerr == CURL_SEEKFUNC_CANTSEEK (can't seek to offset) */
      do {
        size_t readthisamountnow =
          (data->state.resume_from - passed > data->set.buffer_size) ?
          (size_t)data->set.buffer_size :
          curlx_sotouz(data->state.resume_from - passed);

        size_t actuallyread =
          data->state.fread_func(data->state.buffer, 1, readthisamountnow,
                                 data->state.in);

        passed += actuallyread;
        if((actuallyread == 0) || (actuallyread > readthisamountnow)) {
          /* this checks for greater-than only to make sure that the
             CURL_READFUNC_ABORT return code still aborts */
          failf(data, "Failed to read data");
          return CURLE_FTP_COULDNT_USE_REST;
        }
      } while(passed < data->state.resume_from);
    }
    /* now, decrease the size of the read */
    if(data->state.infilesize>0) {
      data->state.infilesize -= data->state.resume_from;

      if(data->state.infilesize <= 0) {
        infof(data, "File already completely uploaded");

        /* no data to transfer */
        Curl_setup_transfer(data, -1, -1, FALSE, -1);

        /* Set ->transfer so that we won't get any error in
         * ftp_done() because we didn't transfer anything! */
        ftp->transfer = PPTRANSFER_NONE;

        state(data, FTP_STOP);
        return CURLE_OK;
      }
    }
    /* we've passed, proceed as normal */
  } /* resume_from */

  result = Curl_pp_sendf(data, &ftpc->pp, append?"APPE %s":"STOR %s",
                         ftpc->file);
  if(!result)
    state(data, FTP_STOR);

  return result;
}